

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O3

void testTiledLineOrder(string *tempDir)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  int in_ECX;
  int extraout_EDX;
  int extraout_EDX_00;
  int in_R8D;
  uint count;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing line orders for tiled files and buffered/unbuffered tile writes",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  bVar1 = IlmThread_2_5::supportsThreads();
  count = 0;
  do {
    bVar2 = IlmThread_2_5::supportsThreads();
    iVar3 = extraout_EDX;
    if (bVar2) {
      Imf_2_5::setGlobalThreadCount(count);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar3 = Imf_2_5::globalThreadCount();
      plVar4 = (long *)std::ostream::operator<<(&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      iVar3 = extraout_EDX_00;
    }
    anon_unknown.dwarf_2d1d47::writeCopyRead
              ((string *)(tempDir->_M_dataplus)._M_p,(int)tempDir->_M_string_length,iVar3,in_ECX,
               in_R8D);
    bVar2 = count < 3;
    count = count + 1;
    in_ECX = CONCAT31((int3)((uint)in_ECX >> 8),bVar2);
  } while (bVar1 && bVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void
testTiledLineOrder (const std::string &tempDir)
{
    try
    {
        cout << "Testing line orders for tiled files and "
		"buffered/unbuffered tile writes" << endl;

        const int W = 171;
        const int H = 259;
        const int XS = 55;
        const int YS = 55;

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    writeCopyRead (tempDir, W, H, XS, YS);
	}

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}